

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditCard.cpp
# Opt level: O0

void __thiscall
CreditCard::CreditCard
          (CreditCard *this,int id,int sender,int receiver,double amount,string *cardNumber,
          string *expirationDate,string *cvv)

{
  string *expirationDate_local;
  string *cardNumber_local;
  double amount_local;
  int receiver_local;
  int sender_local;
  int id_local;
  CreditCard *this_local;
  
  Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_0010bd08;
  std::__cxx11::string::string((string *)&this->cardNumber);
  std::__cxx11::string::string((string *)&this->expirationDate);
  std::__cxx11::string::string((string *)&this->cvv);
  (this->super_Transaction).id = id;
  (this->super_Transaction).sender = sender;
  (this->super_Transaction).receiver = receiver;
  (this->super_Transaction).amount = amount;
  std::__cxx11::string::operator=((string *)&this->cardNumber,(string *)cardNumber);
  std::__cxx11::string::operator=((string *)&this->expirationDate,(string *)expirationDate);
  std::__cxx11::string::operator=((string *)&this->cvv,(string *)cvv);
  return;
}

Assistant:

CreditCard::CreditCard(int id, int sender, int receiver, double amount, string cardNumber, string expirationDate, string cvv)
{
    this->id = id;
    this->sender = sender;
    this->receiver = receiver;
    this->amount = amount;
    this->cardNumber = cardNumber;
    this->expirationDate = expirationDate;
    this->cvv = cvv;
}